

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O3

int x11_authcmp(void *av,void *bv)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  X11FakeAuth *b;
  X11FakeAuth *a;
  
  iVar3 = *av;
  iVar2 = -1;
  if (*bv <= iVar3) {
    if (*bv < iVar3) {
      return 1;
    }
    if (iVar3 == 2) {
      uVar4 = **(ulong **)((long)av + 0x28);
      uVar1 = **(ulong **)((long)bv + 0x28);
      uVar5 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      uVar4 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      return (uint)(uVar4 < uVar5) - (uint)(uVar5 < uVar4);
    }
    if (iVar3 != 1) {
      __assert_fail("a->proto == X11_XDM",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/x11fwd.c"
                    ,0xa3,"int x11_authcmp(void *, void *)");
    }
    iVar3 = *(int *)((long)av + 0x10);
    if ((*(int *)((long)bv + 0x10) <= iVar3) && (iVar2 = 1, iVar3 <= *(int *)((long)bv + 0x10))) {
      iVar3 = memcmp(*(void **)((long)av + 8),*(void **)((long)bv + 8),(long)iVar3);
      return iVar3;
    }
  }
  return iVar2;
}

Assistant:

int x11_authcmp(void *av, void *bv)
{
    struct X11FakeAuth *a = (struct X11FakeAuth *)av;
    struct X11FakeAuth *b = (struct X11FakeAuth *)bv;

    if (a->proto < b->proto)
        return -1;
    else if (a->proto > b->proto)
        return +1;

    if (a->proto == X11_MIT) {
        if (a->datalen < b->datalen)
            return -1;
        else if (a->datalen > b->datalen)
            return +1;

        return memcmp(a->data, b->data, a->datalen);
    } else {
        assert(a->proto == X11_XDM);

        return memcmp(a->xa1_firstblock, b->xa1_firstblock, 8);
    }
}